

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void ClearShrink<std::deque<CompressedHeader,std::allocator<CompressedHeader>>>
               (deque<CompressedHeader,_std::allocator<CompressedHeader>_> *v)

{
  long lVar1;
  deque<CompressedHeader,_std::allocator<CompressedHeader>_> *in_RDI;
  long in_FS_OFFSET;
  deque<CompressedHeader,_std::allocator<CompressedHeader>_> *in_stack_ffffffffffffff98;
  deque<CompressedHeader,_std::allocator<CompressedHeader>_> *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (deque<CompressedHeader,_std::allocator<CompressedHeader>_> *)0x0;
  std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::deque(in_stack_ffffffffffffff98);
  std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::swap(this,in_RDI);
  std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::~deque(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void ClearShrink(V& v) noexcept
{
    // There are various ways to clear a vector and release its memory:
    //
    // 1. V{}.swap(v)
    // 2. v = V{}
    // 3. v = {}; v.shrink_to_fit();
    // 4. v.clear(); v.shrink_to_fit();
    //
    // (2) does not appear to release memory in glibc debug mode, even if v.shrink_to_fit()
    // follows. (3) and (4) rely on std::vector::shrink_to_fit, which is only a non-binding
    // request. Therefore, we use method (1).

    V{}.swap(v);
}